

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-mon-lore.c
# Opt level: O2

void lore_description(textblock *tb,monster_race *race,monster_lore *original_lore,_Bool spoilers)

{
  uint16_t uVar1;
  uint16_t uVar2;
  _Bool _Var3;
  long lVar4;
  monster_lore *pmVar5;
  bitflag known_flags [11];
  monster_lore mutable_lore;
  
  if (((tb != (textblock *)0x0) && (race != (monster_race *)0x0)) &&
     (original_lore != (monster_lore *)0x0)) {
    pmVar5 = &mutable_lore;
    for (lVar4 = 0xe; lVar4 != 0; lVar4 = lVar4 + -1) {
      uVar1 = original_lore->sights;
      uVar2 = original_lore->deaths;
      pmVar5->ridx = original_lore->ridx;
      pmVar5->sights = uVar1;
      pmVar5->deaths = uVar2;
      original_lore = (monster_lore *)&original_lore->pkills;
      pmVar5 = (monster_lore *)&pmVar5->pkills;
    }
    if (spoilers) {
      cheat_monster_lore(race,&mutable_lore);
      monster_flags_known(race,&mutable_lore,known_flags);
      lore_append_flavor(tb,race);
      lore_append_movement(tb,race,&mutable_lore,known_flags);
    }
    else {
      monster_flags_known(race,&mutable_lore,known_flags);
      lore_title(tb,race);
      textblock_append(tb,"\n");
      lore_append_kills(tb,race,&mutable_lore,known_flags);
      lore_append_flavor(tb,race);
      lore_append_movement(tb,race,&mutable_lore,known_flags);
      lore_append_toughness(tb,race,&mutable_lore,known_flags);
      lore_append_exp(tb,race,&mutable_lore,known_flags);
    }
    lore_append_drop(tb,race,&mutable_lore,known_flags);
    lore_append_abilities(tb,race,&mutable_lore,known_flags);
    lore_append_awareness(tb,race,&mutable_lore,known_flags);
    lore_append_friends(tb,race,&mutable_lore,known_flags);
    lore_append_spells(tb,race,&mutable_lore,known_flags);
    lore_append_attack(tb,race,&mutable_lore,known_flags);
    _Var3 = lore_is_fully_known(race);
    if (_Var3) {
      textblock_append(tb,"You know everything about this monster.");
    }
    _Var3 = flag_has_dbg(race->flags,0xb,2,"race->flags","RF_QUESTOR");
    if (_Var3) {
      textblock_append(tb,"You feel an intense desire to kill this monster...  ");
    }
    textblock_append(tb,"\n");
    return;
  }
  __assert_fail("tb && race && original_lore",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-mon-lore.c"
                ,0x60,
                "void lore_description(textblock *, const struct monster_race *, const struct monster_lore *, _Bool)"
               );
}

Assistant:

void lore_description(textblock *tb, const struct monster_race *race,
					  const struct monster_lore *original_lore, bool spoilers)
{
	struct monster_lore mutable_lore;
	struct monster_lore *lore = &mutable_lore;
	bitflag known_flags[RF_SIZE];

	assert(tb && race && original_lore);

	/* Hack -- create a copy of the monster-memory that we can modify */
	memcpy(lore, original_lore, sizeof(struct monster_lore));

	/* Spoilers -- know everything */
	if (spoilers)
		cheat_monster_lore(race, lore);

	/* Now get the known monster flags */
	monster_flags_known(race, lore, known_flags);

	/* Appending the title here simplifies code in the callers. It also causes
	 * a crash when generating spoilers (we don't need titles for them anwyay)*/
	if (!spoilers) {
		lore_title(tb, race);
		textblock_append(tb, "\n");
	}

	/* Show kills of monster vs. player(s) */
	if (!spoilers)
		lore_append_kills(tb, race, lore, known_flags);

	lore_append_flavor(tb, race);

	/* Describe the monster type, speed, life, and armor */
	lore_append_movement(tb, race, lore, known_flags);

	if (!spoilers)
		lore_append_toughness(tb, race, lore, known_flags);

	/* Describe the experience and item reward when killed */
	if (!spoilers)
		lore_append_exp(tb, race, lore, known_flags);

	lore_append_drop(tb, race, lore, known_flags);

	/* Describe the special properties of the monster */
	lore_append_abilities(tb, race, lore, known_flags);
	lore_append_awareness(tb, race, lore, known_flags);
	lore_append_friends(tb, race, lore, known_flags);

	/* Describe the spells, spell-like abilities and melee attacks */
	lore_append_spells(tb, race, lore, known_flags);
	lore_append_attack(tb, race, lore, known_flags);

	/* Do we know everything */
	if (lore_is_fully_known(race))
		textblock_append(tb, "You know everything about this monster.");

	/* Notice "Quest" monsters */
	if (rf_has(race->flags, RF_QUESTOR))
		textblock_append(tb, "You feel an intense desire to kill this monster...  ");

	textblock_append(tb, "\n");
}